

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O1

void __thiscall
amrex::ParmParse::addarr(ParmParse *this,char *name,vector<int,_std::allocator<int>_> *ptr)

{
  int *piVar1;
  _List_node_base *p_Var2;
  _Node *p_Var3;
  int *piVar4;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arr;
  stringstream val;
  allocator local_231;
  _List_node_base *local_230;
  _List_node_base *local_228;
  _List_node_base local_220;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_210;
  string local_1f8;
  string local_1d8;
  PP_entry local_1b8;
  ios_base local_138 [264];
  
  std::__cxx11::string::string((string *)&local_1d8,name,&local_231);
  prefixedName(&local_1f8,this,&local_1d8);
  local_210._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_210;
  local_210._M_impl._M_node._M_size = 0;
  piVar4 = (ptr->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar1 = (ptr->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  local_210._M_impl._M_node.super__List_node_base._M_prev =
       local_210._M_impl._M_node.super__List_node_base._M_next;
  if (piVar4 != piVar1) {
    do {
      std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
      *(undefined8 *)
       ((long)&local_1b8.m_name.field_2 +
       *(long *)(local_1b8.m_name.field_2._M_allocated_capacity - 0x18) + 8) = 0x11;
      std::ostream::operator<<(&local_1b8.m_name.field_2,*piVar4);
      std::__cxx11::stringbuf::str();
      p_Var2 = (_List_node_base *)operator_new(0x30);
      p_Var2[1]._M_next = p_Var2 + 2;
      if (local_230 == &local_220) {
        p_Var2[2]._M_next =
             (_List_node_base *)CONCAT71(local_220._M_next._1_7_,local_220._M_next._0_1_);
        p_Var2[2]._M_prev = local_220._M_prev;
      }
      else {
        p_Var2[1]._M_next = local_230;
        p_Var2[2]._M_next =
             (_List_node_base *)CONCAT71(local_220._M_next._1_7_,local_220._M_next._0_1_);
      }
      p_Var2[1]._M_prev = local_228;
      local_228 = (_List_node_base *)0x0;
      local_220._M_next._0_1_ = 0;
      local_230 = &local_220;
      std::__detail::_List_node_base::_M_hook(p_Var2);
      local_210._M_impl._M_node._M_size = local_210._M_impl._M_node._M_size + 1;
      if (local_230 != &local_220) {
        operator_delete(local_230,CONCAT71(local_220._M_next._1_7_,local_220._M_next._0_1_) + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
      std::ios_base::~ios_base(local_138);
      piVar4 = piVar4 + 1;
    } while (piVar4 != piVar1);
  }
  PP_entry::PP_entry(&local_1b8,&local_1f8,
                     (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_210);
  local_1b8.m_queried = true;
  p_Var3 = std::__cxx11::list<amrex::ParmParse::PP_entry,std::allocator<amrex::ParmParse::PP_entry>>
           ::_M_create_node<amrex::ParmParse::PP_entry_const&>
                     ((list<amrex::ParmParse::PP_entry,std::allocator<amrex::ParmParse::PP_entry>> *
                      )&(anonymous_namespace)::g_table_abi_cxx11_,&local_1b8);
  std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
  _DAT_007563d0 = _DAT_007563d0 + 1;
  PP_entry::~PP_entry(&local_1b8);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
ParmParse::addarr (const char* name,
                const std::vector<int>&  ptr)
{
    saddarr(prefixedName(name),ptr);
}